

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

void __thiscall
kratos::LiftGenVarInstanceVisitor::~LiftGenVarInstanceVisitor(LiftGenVarInstanceVisitor *this)

{
  IRVisitor::~IRVisitor(&this->super_IRVisitor);
  operator_delete(this,0x48);
  return;
}

Assistant:

void visit(Generator* top) override {
        // we are only interested in generator instances that shares the same name
        // and has the same hash
        std::unordered_map<uint64_t, std::vector<ModuleInstantiationStmt*>> generator_map;
        // we use the hash value. I'm pretty sure that this won't catch all the corner cases
        // but it's good enough for now
        auto const* context = top->context();
        // we assume the module instantiation is done
        for (auto const& stmt : top->get_all_stmts()) {
            if (stmt->type() == StatementType::ModuleInstantiation) {
                auto* inst = reinterpret_cast<ModuleInstantiationStmt*>(stmt.get());
                auto const* gen = inst->target();

                if (!context->has_hash(gen)) {
                    throw UserException("Cannot find hash for generator");
                }
                auto hash = context->get_hash(gen);
                generator_map[hash].emplace_back(inst);
            }
        }

        // only interested in entries that has more than 1 entries
        for (auto const& [hash, generators] : generator_map) {
            if (generators.size() <= 1) continue;
            std::unordered_map<std::string, PortInfo> port_mapping;
            bool check = check_child_instance(generators, port_mapping);
            if (check) {
                // change it to a loop structure
                create_gen_var_instance(generators, port_mapping);
            }
        }
    }